

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::AbortingErrorCollector::RecordError
          (AbortingErrorCollector *this,string_view filename,string_view element_name,
          Message *message,ErrorLocation location,string_view error_message)

{
  string_view v;
  string_view v_00;
  LogMessage *pLVar1;
  LogMessage local_50;
  Voidify local_39;
  Message *local_38;
  Message *message_local;
  AbortingErrorCollector *this_local;
  string_view element_name_local;
  string_view filename_local;
  
  element_name_local._M_len = (size_t)element_name._M_str;
  this_local = (AbortingErrorCollector *)element_name._M_len;
  element_name_local._M_str = (char *)filename._M_len;
  local_38 = message;
  message_local = (Message *)this;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0x36be);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [33])"AddError() called unexpectedly: ");
  v_00._M_str = filename._M_str;
  v_00._M_len = (size_t)element_name_local._M_str;
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v_00);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [3])0x1ea2ea0);
  v._M_str = (char *)element_name_local._M_len;
  v._M_len = (size_t)this_local;
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [4])0x213355f);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,error_message);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void RecordError(absl::string_view filename, absl::string_view element_name,
                   const Message* message, ErrorLocation location,
                   absl::string_view error_message) override {
    ABSL_LOG(FATAL) << "AddError() called unexpectedly: " << filename << " ["
                    << element_name << "]: " << error_message;
  }